

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

base_learner * CSOAA::csldf_setup(options_i *options,vw *all)

{
  long *plVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  pointer plVar5;
  undefined8 uVar6;
  vw_exception *this;
  single_learner *predict;
  vw *pvVar7;
  base_learner *pbVar8;
  vw *in_RSI;
  long *in_RDI;
  learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  prediction_type_t pred_type;
  features fs;
  string loss_function_type;
  stringstream __msg_1;
  stringstream __msg;
  string ldf_arg;
  option_group_definition csldf_inner_options;
  option_group_definition csldf_outer_options;
  string wap_ldf;
  string ldf_override;
  string csoaa_ldf;
  free_ptr<CSOAA::ldf> ld;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff0b8;
  prediction_type_t pred_type_00;
  vw *in_stack_fffffffffffff0c0;
  string *in_stack_fffffffffffff0c8;
  base_learner *in_stack_fffffffffffff0d0;
  string *in_stack_fffffffffffff0d8;
  learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_fffffffffffff0e0;
  undefined7 in_stack_fffffffffffff0e8;
  undefined1 in_stack_fffffffffffff0ef;
  vw_exception *in_stack_fffffffffffff0f0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff108;
  option_group_definition *in_stack_fffffffffffff110;
  allocator *paVar9;
  learner<char,_char> *in_stack_fffffffffffff280;
  uint64_t in_stack_fffffffffffff298;
  unsigned_long *in_stack_fffffffffffff2a0;
  v_hashmap<unsigned_long,_features> *in_stack_fffffffffffff2a8;
  stringstream local_d20 [16];
  ostream local_d10;
  undefined1 local_b91;
  stringstream local_b70 [16];
  ostream local_b60;
  allocator local_9e1;
  string local_9e0 [39];
  allocator local_9b9;
  string local_9b8 [32];
  string local_998 [32];
  undefined4 local_978;
  allocator local_971;
  string local_970 [39];
  allocator local_949;
  string local_948 [39];
  allocator local_921;
  string local_920 [39];
  allocator local_8f9;
  string local_8f8 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8d8 [2];
  allocator local_791;
  string local_790 [32];
  undefined1 local_770 [63];
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [32];
  typed_option<bool> local_6e8 [2];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [32];
  typed_option<bool> local_558 [2];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [359];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238 [2];
  allocator local_e1;
  string local_e0 [32];
  undefined1 local_c0 [56];
  string local_88 [32];
  string local_68 [32];
  string local_48 [48];
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<CSOAA::ldf>();
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,"Cost Sensitive One Against All with Label Dependent Features",&local_e1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0c0,
             (string *)in_stack_fffffffffffff0b8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"csoaa_ldf",&local_259);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff0c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0c0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_238,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_280,"Use one-against-all multiclass learning with label dependent features.",
             &local_281);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff0c0,(string *)in_stack_fffffffffffff0b8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"ldf_override",&local_3e9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff0c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_410,
             "Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file",
             &local_411);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff0c0,(string *)in_stack_fffffffffffff0b8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_578,"csoaa_rank",&local_579);
  std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cacdb);
  VW::config::make_option<bool>(in_stack_fffffffffffff0c8,(bool *)in_stack_fffffffffffff0c0);
  VW::config::typed_option<bool>::keep(local_558,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"Return actions sorted by score order",&local_5a1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff0c0,(string *)in_stack_fffffffffffff0b8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff0c0,
             (typed_option<bool> *)in_stack_fffffffffffff0b8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff110,(typed_option<bool> *)in_stack_fffffffffffff108);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"probabilities",&local_709);
  std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cae26);
  VW::config::make_option<bool>(in_stack_fffffffffffff0c8,(bool *)in_stack_fffffffffffff0c0);
  VW::config::typed_option<bool>::keep(local_6e8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_730,"predict probabilites of all classes",&local_731);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff0c0,(string *)in_stack_fffffffffffff0b8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff0c0,
             (typed_option<bool> *)in_stack_fffffffffffff0b8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff110,(typed_option<bool> *)in_stack_fffffffffffff108);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_790,"Cost Sensitive One Against All with Label Dependent Features",&local_791);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0c0,
             (string *)in_stack_fffffffffffff0b8);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f8,"wap_ldf",&local_8f9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff0c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0c0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_8d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_920,
             "Use weighted all-pairs multiclass learning with label dependent features.  Specify singleline or multiline."
             ,&local_921);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff0c0,(string *)in_stack_fffffffffffff0b8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  (**(code **)*local_10)(local_10,local_c0);
  plVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_948,"csoaa_ldf",&local_949);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_948);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    (**(code **)*local_10)(local_10,local_770);
    plVar1 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_970,"wap_ldf",&local_971);
    bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_970);
    std::__cxx11::string::~string(local_970);
    std::allocator<char>::~allocator((allocator<char> *)&local_971);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      local_8 = (base_learner *)0x0;
      local_978 = 1;
      goto LAB_003cc0e5;
    }
  }
  pvVar7 = local_18;
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cb7eb);
  plVar5->all = pvVar7;
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cb801);
  plVar5->first_pass = true;
  std::__cxx11::string::string(local_998);
  plVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b8,"csoaa_ldf",&local_9b9);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_9b8);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::string::operator=(local_998,local_88);
    plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cb937);
    plVar5->is_wap = true;
  }
  else {
    std::__cxx11::string::operator=(local_998,local_48);
  }
  paVar9 = &local_9e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e0,"ldf_override",paVar9);
  bVar2 = (**(code **)(*local_10 + 8))(local_10,local_9e0);
  std::__cxx11::string::~string(local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  if ((bVar2 & 1) != 0) {
    std::__cxx11::string::operator=(local_998,local_68);
  }
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cba27);
  if ((plVar5->rank & 1U) != 0) {
    local_18->delete_prediction = ACTION_SCORE::delete_action_scores;
  }
  memcpy(&local_18->p->lp,&COST_SENSITIVE::cs_label,0x48);
  local_18->label_type = cs;
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cba89);
  plVar5->treat_as_classifier = false;
  iVar4 = std::__cxx11::string::compare((char *)local_998);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_998), iVar4 == 0)) {
    plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cbacf);
    plVar5->treat_as_classifier = false;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)local_998);
    if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_998), iVar4 == 0)) {
      plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cbb1a);
      plVar5->treat_as_classifier = true;
    }
    else {
      if ((local_18->training & 1U) != 0) {
        std::__cxx11::stringstream::stringstream(local_b70);
        iVar4 = (int)((ulong)in_stack_fffffffffffff0e0 >> 0x20);
        std::operator<<(&local_b60,"ldf requires either m/multiline or mc/multiline-classifier");
        local_b91 = 1;
        uVar6 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffff0f0,
                   (char *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),iVar4,
                   in_stack_fffffffffffff0d8);
        local_b91 = 0;
        __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      iVar4 = std::__cxx11::string::compare((char *)local_998);
      if ((((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_998), iVar4 == 0))
          || (iVar4 = std::__cxx11::string::compare((char *)local_998), iVar4 == 0)) ||
         (iVar4 = std::__cxx11::string::compare((char *)local_998), iVar4 == 0)) {
        iVar4 = (int)((ulong)in_stack_fffffffffffff0e0 >> 0x20);
        std::__cxx11::stringstream::stringstream(local_d20);
        std::operator<<(&local_d10,
                        "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no longer supported"
                       );
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (this,(char *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),iVar4,
                   in_stack_fffffffffffff0d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
  }
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cbdd2);
  if ((plVar5->is_probabilities & 1U) != 0) {
    local_18->sd->report_multiclass_log_loss = true;
    (**local_18->loss->_vptr_loss_function)(&stack0xfffffffffffff298);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff0c0,(char *)in_stack_fffffffffffff0b8);
    if (bVar3) {
      in_stack_fffffffffffff0e0 =
           (learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *)
           std::operator<<(&(local_18->trace_message).super_ostream,
                           "WARNING: --probabilities should be used only with --loss_function=logistic"
                          );
      std::ostream::operator<<(in_stack_fffffffffffff0e0,std::endl<char,std::char_traits<char>>);
    }
    plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cbea0);
    if ((plVar5->treat_as_classifier & 1U) == 0) {
      in_stack_fffffffffffff0d8 =
           (string *)
           std::operator<<(&(local_18->trace_message).super_ostream,
                           "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)")
      ;
      std::ostream::operator<<(in_stack_fffffffffffff0d8,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff298);
  }
  pred_type_00 = (prediction_type_t)((ulong)in_stack_fffffffffffff0b8 >> 0x20);
  local_18->p->emptylines_separate_examples = true;
  features::features((features *)pvVar7);
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cbf1c);
  v_hashmap<unsigned_long,_features>::init(&plVar5->label_features,(EVP_PKEY_CTX *)0x100);
  std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cbf47);
  v_hashmap<unsigned_long,_features>::get
            (in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cbf77);
  if ((plVar5->rank & 1U) == 0) {
    std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
              ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cbf9a);
  }
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x3cbfca);
  plVar5->read_example_this_loop = 0;
  in_stack_fffffffffffff0d0 =
       setup_base((options_i *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
  predict = LEARNER::as_singleline<char,char>(in_stack_fffffffffffff280);
  pvVar7 = (vw *)LEARNER::
                 init_learner<CSOAA::ldf,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,example>>
                           ((free_ptr<CSOAA::ldf> *)in_stack_fffffffffffff0e0,
                            (learner<char,_example> *)in_stack_fffffffffffff0d8,
                            (_func_void_ldf_ptr_learner<char,_example>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                             *)in_stack_fffffffffffff0d0,
                            (_func_void_ldf_ptr_learner<char,_example>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                             *)predict,(size_t)in_stack_fffffffffffff0c0,pred_type_00);
  in_stack_fffffffffffff0c0 = pvVar7;
  LEARNER::learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_>::
  set_finish_example((learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                     pvVar7,finish_multiline_example);
  LEARNER::learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish
            (in_stack_fffffffffffff0e0,(_func_void_ldf_ptr *)in_stack_fffffffffffff0d8);
  LEARNER::learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_>::set_end_pass
            (in_stack_fffffffffffff0e0,(_func_void_ldf_ptr *)in_stack_fffffffffffff0d8);
  pbVar8 = LEARNER::make_base<CSOAA::ldf,std::vector<example*,std::allocator<example*>>>
                     ((learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                      pvVar7);
  local_18->cost_sensitive = pbVar8;
  local_8 = local_18->cost_sensitive;
  local_978 = 1;
  std::__cxx11::string::~string(local_998);
LAB_003cc0e5:
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0c0);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0c0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)in_stack_fffffffffffff0d0);
  return local_8;
}

Assistant:

base_learner* csldf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<ldf>();

  std::string csoaa_ldf;
  std::string ldf_override;
  std::string wap_ldf;

  option_group_definition csldf_outer_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_outer_options.add(make_option("csoaa_ldf", csoaa_ldf)
                              .keep()
                              .help("Use one-against-all multiclass learning with label dependent features."));
  csldf_outer_options.add(
      make_option("ldf_override", ldf_override)
          .help("Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file"));
  csldf_outer_options.add(make_option("csoaa_rank", ld->rank).keep().help("Return actions sorted by score order"));
  csldf_outer_options.add(
      make_option("probabilities", ld->is_probabilities).keep().help("predict probabilites of all classes"));

  option_group_definition csldf_inner_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_inner_options.add(make_option("wap_ldf", wap_ldf)
                              .keep()
                              .help("Use weighted all-pairs multiclass learning with label dependent features.  "
                                    "Specify singleline or multiline."));

  options.add_and_parse(csldf_outer_options);
  if (!options.was_supplied("csoaa_ldf"))
  {
    options.add_and_parse(csldf_inner_options);
    if (!options.was_supplied("wap_ldf"))
    {
      return nullptr;
    }
  }

  ld->all = &all;
  ld->first_pass = true;

  string ldf_arg;

  if (options.was_supplied("csoaa_ldf"))
    ldf_arg = csoaa_ldf;
  else
  {
    ldf_arg = wap_ldf;
    ld->is_wap = true;
  }
  if (options.was_supplied("ldf_override"))
    ldf_arg = ldf_override;
  if (ld->rank)
    all.delete_prediction = delete_action_scores;

  all.p->lp = COST_SENSITIVE::cs_label;
  all.label_type = label_type::cs;

  ld->treat_as_classifier = false;
  if (ldf_arg.compare("multiline") == 0 || ldf_arg.compare("m") == 0)
    ld->treat_as_classifier = false;
  else if (ldf_arg.compare("multiline-classifier") == 0 || ldf_arg.compare("mc") == 0)
    ld->treat_as_classifier = true;
  else
  {
    if (all.training)
      THROW("ldf requires either m/multiline or mc/multiline-classifier");
    if ((ldf_arg.compare("singleline") == 0 || ldf_arg.compare("s") == 0) ||
        (ldf_arg.compare("singleline-classifier") == 0 || ldf_arg.compare("sc") == 0))
      THROW(
          "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no "
          "longer supported");
  }

  if (ld->is_probabilities)
  {
    all.sd->report_multiclass_log_loss = true;
    auto loss_function_type = all.loss->getType();
    if (loss_function_type != "logistic")
      all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
    if (!ld->treat_as_classifier)
      all.trace_message << "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)" << endl;
  }

  all.p->emptylines_separate_examples = true;  // TODO: check this to be sure!!!  !ld->is_singleline;

  features fs;
  ld->label_features.init(256, fs, LabelDict::size_t_eq);
  ld->label_features.get(1, 94717244);  // TODO: figure this out
  prediction_type::prediction_type_t pred_type;

  if (ld->rank)
    pred_type = prediction_type::action_scores;
  else if (ld->is_probabilities)
    pred_type = prediction_type::prob;
  else
    pred_type = prediction_type::multiclass;

  ld->read_example_this_loop = 0;
  learner<ldf, multi_ex>& l = init_learner(ld, as_singleline(setup_base(*all.options, all)), do_actual_learning<true>,
      do_actual_learning<false>, 1, pred_type);
  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  l.set_end_pass(end_pass);
  all.cost_sensitive = make_base(l);
  return all.cost_sensitive;
}